

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O2

int fwrite_xattr(CURL *curl,int fd)

{
  int iVar1;
  char *__name;
  bool bVar2;
  char *__value;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t __size;
  long lVar6;
  char *value;
  int local_3c;
  char *local_38;
  
  lVar6 = 0;
  iVar4 = 0;
  local_3c = fd;
  do {
    if ((iVar4 != 0) || (lVar6 == 0x20)) {
      return iVar4;
    }
    __name = *(char **)((long)&mappings[0].attr + lVar6);
    value = (char *)0x0;
    iVar1 = *(int *)((long)&mappings[0].info + lVar6);
    iVar4 = 0;
    iVar3 = curl_easy_getinfo(curl,iVar1,&value);
    if (value != (char *)0x0 && iVar3 == 0) {
      if (iVar1 == 0x100001) {
        lVar5 = curl_url();
        if (lVar5 == 0) {
LAB_0011c137:
          curl_url_cleanup(lVar5);
          bVar2 = false;
        }
        else {
          iVar4 = curl_url_set(lVar5,0,value,0);
          if (iVar4 != 0) goto LAB_0011c137;
          iVar4 = curl_url_set(lVar5,2,0,0);
          if (iVar4 != 0) goto LAB_0011c137;
          iVar4 = curl_url_set(lVar5,3,0,0);
          if (iVar4 != 0) goto LAB_0011c137;
          iVar4 = curl_url_get(lVar5,0,&local_38,0);
          if (iVar4 != 0) goto LAB_0011c137;
          curl_url_cleanup(lVar5);
          value = local_38;
          bVar2 = true;
        }
        if (value == (char *)0x0) {
          iVar4 = 0;
          goto LAB_0011c17e;
        }
      }
      else {
        bVar2 = false;
      }
      __value = value;
      __size = strlen(value);
      iVar4 = fsetxattr(local_3c,__name,__value,__size,0);
      if (bVar2) {
        curl_free(value);
      }
    }
LAB_0011c17e:
    lVar6 = lVar6 + 0x10;
  } while( true );
}

Assistant:

int fwrite_xattr(CURL *curl, int fd)
{
  int i = 0;
  int err = 0;

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(err == 0 && mappings[i].attr != NULL) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value) {
      bool freeptr = FALSE;
      if(CURLINFO_EFFECTIVE_URL == mappings[i].info)
        freeptr = stripcredentials(&value);
      if(value) {
#ifdef HAVE_FSETXATTR_6
        err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0, 0);
#elif defined(HAVE_FSETXATTR_5)
        err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0);
#elif defined(__FreeBSD_version)
        {
          ssize_t rc = extattr_set_fd(fd, EXTATTR_NAMESPACE_USER,
                                      mappings[i].attr, value, strlen(value));
          /* FreeBSD's extattr_set_fd returns the length of the extended
             attribute */
          err = (rc < 0 ? -1 : 0);
        }
#endif
        if(freeptr)
          curl_free(value);
      }
    }
    i++;
  }

  return err;
}